

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O0

void __thiscall ArgParser::initOptions(ArgParser *this)

{
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  function<void_()> local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  anon_class_8_1_8991fb9c local_498;
  bare_arg_handler_t local_490;
  allocator<char> local_469;
  string local_468;
  anon_class_8_1_8991fb9c local_448;
  bare_arg_handler_t local_440;
  allocator<char> local_419;
  string local_418;
  anon_class_8_1_8991fb9c local_3f8;
  bare_arg_handler_t local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  function<void_()> local_3a8;
  allocator<char> local_381;
  string local_380;
  anon_class_8_1_8991fb9c local_360;
  bare_arg_handler_t local_358;
  allocator<char> local_331;
  string local_330;
  code *local_310;
  undefined8 local_308;
  bare_arg_handler_t local_300;
  code *local_2e0;
  undefined8 local_2d8;
  param_arg_handler_t local_2d0;
  code *local_2b0;
  undefined8 local_2a8;
  bare_arg_handler_t local_2a0;
  allocator<char> local_279;
  string local_278;
  code *local_258;
  undefined8 local_250;
  bare_arg_handler_t local_248;
  allocator<char> local_221;
  string local_220;
  anon_class_8_1_8991fb9c local_200;
  bare_arg_handler_t local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  code *local_1b0;
  undefined8 local_1a8;
  param_arg_handler_t local_1a0;
  allocator<char> local_179;
  string local_178;
  char *pcStack_158;
  char *choices [4];
  param_arg_handler_t local_128;
  allocator<char> local_101;
  string local_100;
  code *local_e0;
  undefined8 local_d8;
  param_arg_handler_t local_d0;
  allocator<char> local_a9;
  string local_a8;
  code *local_88;
  undefined8 local_80;
  bare_arg_handler_t local_78;
  allocator<char> local_41;
  string local_40;
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c p;
  anon_class_8_1_8991fb9c b;
  ArgParser *this_local;
  
  local_20.this = this;
  p.this = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"potato",&local_41);
  local_88 = handlePotato;
  local_80 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_78,&p,0x1205f0);
  QPDFArgParser::addBare(&this->ap,&local_40,&local_78);
  std::function<void_()>::~function(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"salad",&local_a9);
  local_e0 = handleSalad;
  local_d8 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_d0,&local_20,0x1206f0);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_a8,&local_d0,"tossed");
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"moo",&local_101);
  choices[3] = (char *)handleMoo;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_128,&local_20,0x1207c0);
  QPDFArgParser::addOptionalParameter(&this->ap,&local_100,&local_128);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  choices[1] = "sow";
  choices[2] = (char *)0x0;
  pcStack_158 = "pig";
  choices[0] = "boar";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"oink",&local_179);
  local_1b0 = handleOink;
  local_1a8 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_1a0,&local_20,0x120960);
  QPDFArgParser::addChoices(&this->ap,&local_178,&local_1a0,true,&pcStack_158);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1a0);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  QPDFArgParser::selectHelpOptionTable(&this->ap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"version",&local_1d1);
  local_200.this = this;
  std::function<void()>::function<ArgParser::initOptions()::__0,void>
            ((function<void()> *)&local_1f8,&local_200);
  QPDFArgParser::addBare(&this->ap,&local_1d0,&local_1f8);
  std::function<void_()>::~function(&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"quack",&local_221);
  local_258 = startQuack;
  local_250 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_248,&p,0x120ac0);
  QPDFArgParser::addBare(&this->ap,&local_220,&local_248);
  std::function<void_()>::~function(&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"quack",&local_279);
  local_2b0 = endQuack;
  local_2a8 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_2a0,&p,0x120ce0);
  QPDFArgParser::registerOptionTable(&this->ap,&local_278,&local_2a0);
  std::function<void_()>::~function(&local_2a0);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  local_2e0 = getQuack;
  local_2d8 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_2d0,&local_20,0x120d80);
  QPDFArgParser::addPositional(&this->ap,&local_2d0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2d0);
  local_310 = finalChecks;
  local_308 = 0;
  initOptions::anon_class_8_1_8991fb9c::operator()(&local_300,&p,0x120fb0);
  QPDFArgParser::addFinalCheck(&this->ap,&local_300);
  std::function<void_()>::~function(&local_300);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"baaa",&local_331);
  local_360.this = this;
  std::function<void()>::function<ArgParser::initOptions()::__1,void>
            ((function<void()> *)&local_358,&local_360);
  QPDFArgParser::addBare(&this->ap,&local_330,&local_358);
  std::function<void_()>::~function(&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"baaa",&local_381);
  std::function<void_()>::function(&local_3a8,(nullptr_t)0x0);
  QPDFArgParser::registerOptionTable(&this->ap,&local_380,&local_3a8);
  std::function<void_()>::~function(&local_3a8);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"ewe",&local_3c9);
  local_3f8.this = this;
  std::function<void()>::function<ArgParser::initOptions()::__2,void>
            ((function<void()> *)&local_3f0,&local_3f8);
  QPDFArgParser::addBare(&this->ap,&local_3c8,&local_3f0);
  std::function<void_()>::~function(&local_3f0);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"ram",&local_419);
  local_448.this = this;
  std::function<void()>::function<ArgParser::initOptions()::__3,void>
            ((function<void()> *)&local_440,&local_448);
  QPDFArgParser::addBare(&this->ap,&local_418,&local_440);
  std::function<void_()>::~function(&local_440);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"sheep",&local_469);
  local_498.this = this;
  std::function<void()>::function<ArgParser::initOptions()::__4,void>
            ((function<void()> *)&local_490,&local_498);
  QPDFArgParser::addBare(&this->ap,&local_468,&local_490);
  std::function<void_()>::~function(&local_490);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"sheep",&local_4b9);
  std::function<void_()>::function(&local_4e0,(nullptr_t)0x0);
  QPDFArgParser::registerOptionTable(&this->ap,&local_4b8,&local_4e0);
  std::function<void_()>::~function(&local_4e0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"For more help, read the manual.\n",&local_501);
  QPDFArgParser::addHelpFooter(&this->ap,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"quack",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"Quack Options",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"Just put stuff after quack to get a count at the end.\n",
             &local_579);
  QPDFArgParser::addHelpTopic(&this->ap,&local_528,&local_550,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"baaa",&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"Baaa Options",&local_5c9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,
             "Ewe can do sheepish things.\nFor example, ewe can add more ram to your computer.\n",
             &local_5f1);
  QPDFArgParser::addHelpTopic(&this->ap,&local_5a0,&local_5c8,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"--ewe",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"baaa",&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"just for ewe",&local_669)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"You are not a ewe.\n",&local_691);
  QPDFArgParser::addOptionHelp(&this->ap,&local_618,&local_640,&local_668,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"--ram",&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"baaa",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"curly horns",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"",&local_731);
  QPDFArgParser::addOptionHelp(&this->ap,&local_6b8,&local_6e0,&local_708,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  return;
}

Assistant:

void
ArgParser::initOptions()
{
    auto b = [this](void (ArgParser::*f)()) { return QPDFArgParser::bindBare(f, this); };
    auto p = [this](void (ArgParser::*f)(std::string const&)) {
        return QPDFArgParser::bindParam(f, this);
    };

    ap.addBare("potato", b(&ArgParser::handlePotato));
    ap.addRequiredParameter("salad", p(&ArgParser::handleSalad), "tossed");
    ap.addOptionalParameter("moo", p(&ArgParser::handleMoo));
    char const* choices[] = {"pig", "boar", "sow", nullptr};
    ap.addChoices("oink", p(&ArgParser::handleOink), true, choices);
    ap.selectHelpOptionTable();
    ap.addBare("version", [this]() { output("3.14159"); });
    ap.selectMainOptionTable();
    ap.addBare("quack", b(&ArgParser::startQuack));
    ap.registerOptionTable("quack", b(&ArgParser::endQuack));
    ap.addPositional(p(&ArgParser::getQuack));
    ap.addFinalCheck(b(&ArgParser::finalChecks));
    ap.selectMainOptionTable();
    ap.addBare("baaa", [this]() { this->ap.selectOptionTable("baaa"); });
    ap.registerOptionTable("baaa", nullptr);
    ap.addBare("ewe", [this]() { output("you"); });
    ap.addBare("ram", [this]() { output("ram"); });
    ap.selectMainOptionTable();
    ap.addBare("sheep", [this]() { this->ap.selectOptionTable("sheep"); });
    ap.registerOptionTable("sheep", nullptr);

    ap.addHelpFooter("For more help, read the manual.\n");
    ap.addHelpTopic(
        "quack", "Quack Options", "Just put stuff after quack to get a count at the end.\n");
    ap.addHelpTopic(
        "baaa",
        "Baaa Options",
        "Ewe can do sheepish things.\n"
        "For example, ewe can add more ram to your computer.\n");
    ap.addOptionHelp("--ewe", "baaa", "just for ewe", "You are not a ewe.\n");
    ap.addOptionHelp("--ram", "baaa", "curly horns", "");
}